

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hierarchic_fe.cc
# Opt level: O0

double lf::fe::Jacobi(uint n,double alpha,double beta,double x)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double alpha4;
  double alpha3;
  double alpha2;
  double alpha1;
  double dStack_48;
  uint j;
  double p2;
  double p1;
  double p0;
  double x_local;
  double beta_local;
  double alpha_local;
  double dStack_10;
  uint n_local;
  
  dVar1 = x + x + -1.0;
  if (n == 0) {
    dStack_10 = 1.0;
  }
  else if (n == 1) {
    dStack_10 = (dVar1 * (alpha + beta + 2.0) + (alpha - beta)) * 0.5;
  }
  else {
    p1 = 1.0;
    p2 = (dVar1 * (alpha + beta + 2.0) + (alpha - beta)) * 0.5;
    dStack_48 = 0.0;
    for (alpha1._4_4_ = 1; alpha1._4_4_ < n; alpha1._4_4_ = alpha1._4_4_ + 1) {
      dVar3 = (double)(alpha1._4_4_ * 2) + alpha + beta;
      dVar2 = (double)alpha1._4_4_ + alpha;
      dStack_48 = (1.0 / ((double)(alpha1._4_4_ * 2 + 2) *
                          ((double)alpha1._4_4_ + alpha + beta + 1.0) *
                         ((double)(alpha1._4_4_ * 2) + alpha + beta))) *
                  ((dVar3 * (dVar3 + 1.0) * (dVar3 + 2.0) * dVar1 +
                   ((double)(alpha1._4_4_ * 2) + alpha + beta + 1.0) * (alpha * alpha - beta * beta)
                   ) * p2 + -((dVar2 + dVar2) * ((double)alpha1._4_4_ + beta) *
                              ((double)(alpha1._4_4_ * 2) + alpha + beta + 2.0) * p1));
      p1 = p2;
      p2 = dStack_48;
    }
    dStack_10 = dStack_48;
  }
  return dStack_10;
}

Assistant:

double Jacobi(unsigned n, double alpha, double beta, double x) {
  // The recurrence relation is for the non-shifted Jacobi Polynomials
  // We thus map [0, 1] onto [-1, 1]
  x = 2 * x - 1;
  if (n == 0) {
    return 1;
  }
  if (n == 1) {
    return 0.5 * (alpha - beta + x * (alpha + beta + 2));
  }
  double p0 = 1;
  double p1 = 0.5 * (alpha - beta + x * (alpha + beta + 2));
  double p2 = 0;
  for (unsigned j = 1; j < n; ++j) {
    const double alpha1 =
        2 * (j + 1) * (j + alpha + beta + 1) * (2 * j + alpha + beta);
    const double alpha2 =
        (2 * j + alpha + beta + 1) * (alpha * alpha - beta * beta);
    const double alpha3 = (2 * j + alpha + beta) * (2 * j + alpha + beta + 1) *
                          (2 * j + alpha + beta + 2);
    const double alpha4 =
        2 * (j + alpha) * (j + beta) * (2 * j + alpha + beta + 2);
    p2 = 1. / alpha1 * ((alpha2 + alpha3 * x) * p1 - alpha4 * p0);
    p0 = p1;
    p1 = p2;
  }
  return p2;
}